

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int cmsys::SystemTools::GetTerminalWidth(void)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  uint uVar3;
  uint uVar4;
  char *endptr;
  winsize ws;
  char *local_20;
  short local_18;
  ushort local_16;
  
  iVar1 = ioctl(1,0x5413,&local_18);
  uVar4 = -(uint)(local_18 == 0) | (uint)local_16 | -(uint)(local_16 == 0);
  if (iVar1 == -1) {
    uVar4 = 0xffffffff;
  }
  iVar1 = isatty(1);
  uVar4 = -(uint)(iVar1 == 0) | uVar4;
  __nptr = getenv("COLUMNS");
  if ((__nptr != (char *)0x0) && (*__nptr != '\0')) {
    lVar2 = strtol(__nptr,&local_20,0);
    if (local_20 != (char *)0x0) {
      uVar3 = uVar4;
      if (lVar2 - 1U < 999) {
        uVar3 = (uint)lVar2;
      }
      if (*local_20 == '\0') {
        uVar4 = uVar3;
      }
    }
  }
  uVar3 = 0xffffffff;
  if (8 < (int)uVar4) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

int SystemTools::GetTerminalWidth()
{
  int width = -1;
#ifdef HAVE_TTY_INFO
  struct winsize ws;
  char *columns; /* Unix98 environment variable */
  if(ioctl(1, TIOCGWINSZ, &ws) != -1 && ws.ws_col>0 && ws.ws_row>0)
    {
    width = ws.ws_col;
    }
  if(!isatty(STDOUT_FILENO))
    {
    width = -1;
    }
  columns = getenv("COLUMNS");
  if(columns && *columns)
    {
    long t;
    char *endptr;
    t = strtol(columns, &endptr, 0);
    if(endptr && !*endptr && (t>0) && (t<1000))
      {
      width = static_cast<int>(t);
      }
    }
  if ( width < 9 )
    {
    width = -1;
    }
#endif
  return width;
}